

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

void snga_dest_indices(Integer ndims,Integer *los,Integer *blos,Integer *dimss,Integer ndimd,
                      Integer *lod,Integer *blod,Integer *dimsd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  if (ndims < 1) {
    ndims = lVar3;
  }
  lVar1 = 1;
  for (lVar2 = 0; ndims != lVar2; lVar2 = lVar2 + 1) {
    lVar3 = lVar3 + (los[lVar2] - blos[lVar2]) * lVar1;
    lVar1 = lVar1 * dimss[lVar2];
  }
  for (lVar1 = 0; ndims != lVar1; lVar1 = lVar1 + 1) {
    *(long *)(ndimd + lVar1 * 8) = lVar3 % blod[lVar1] + lod[lVar1];
    lVar3 = lVar3 / blod[lVar1];
  }
  return;
}

Assistant:

static void snga_dest_indices(Integer ndims, Integer *los, Integer *blos, Integer *dimss,
               Integer ndimd, Integer *lod, Integer *blod, Integer *dimsd)
{
    Integer idx = 0, i, factor=1;
        
    for(i=0;i<ndims;i++) {
        idx += (los[i] - blos[i])*factor;
        factor *= dimss[i];
    }
        
    for(i=0;i<ndims;i++) {
        lod[i] = idx % dimsd[i] + blod[i];
        idx /= dimsd[i];
    }
}